

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_btGetAllMatches_extDict_3
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *iStart;
  BYTE *__s1;
  uint uVar3;
  uint uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  long lVar7;
  U32 lowestValid;
  U32 UVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  BYTE *mEnd;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  uint *puVar20;
  uint uVar21;
  long lVar22;
  uint *puVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong *puVar27;
  ulong *puVar28;
  uint uVar29;
  ulong uVar30;
  BYTE *__s1_00;
  uint uVar31;
  U32 UVar32;
  uint uVar33;
  ulong uVar34;
  BYTE *pStart;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  BYTE *pInLoopLimit;
  uint local_e0;
  uint *local_a8;
  uint local_54;
  U32 *local_50;
  U32 *local_48;
  ulong local_40;
  U32 *local_38;
  
  if (3 < (ms->cParams).minMatch) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar5 = (ms->window).base;
  uVar36 = (ulong)ms->nextToUpdate;
  if (ip < pBVar5 + uVar36) {
    return 0;
  }
  local_50 = nextToUpdate3;
  while( true ) {
    uVar37 = (uint)uVar36;
    uVar9 = (uint)((long)ip - (long)pBVar5);
    if (uVar9 <= uVar37) break;
    UVar8 = ZSTD_insertBt1(ms,pBVar5 + uVar36,iHighLimit,uVar9,3,1);
    uVar36 = (ulong)(UVar8 + uVar37);
    if (UVar8 + uVar37 <= uVar37) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x236,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar5) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x239,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar5) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x23a,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar9;
  uVar9 = (ms->cParams).targetLength;
  uVar37 = 0xfff;
  if (uVar9 < 0xfff) {
    uVar37 = uVar9;
  }
  uVar9 = (ms->cParams).hashLog;
  if (0x20 < uVar9) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_40 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar9 & 0x1fU));
  pBVar5 = (ms->window).base;
  uVar31 = (int)ip - (int)pBVar5;
  uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar36 = 0;
  uVar9 = uVar31 - uVar33;
  if (uVar31 < uVar33) {
    uVar9 = 0;
  }
  uVar10 = (ms->window).lowLimit;
  uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar29 = uVar31 - uVar24;
  if (uVar31 - uVar10 <= uVar24) {
    uVar29 = uVar10;
  }
  if (ms->loadedDictEnd != 0) {
    uVar29 = uVar10;
  }
  uVar10 = uVar29 + (uVar29 == 0);
  uVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x27a,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  local_48 = ms->hashTable;
  uVar3 = local_48[local_40];
  local_38 = ms->chainTable;
  pBVar6 = (ms->window).dictBase;
  uVar4 = (ms->window).dictLimit;
  uVar34 = (ulong)uVar4;
  mEnd = pBVar6 + uVar34;
  iStart = pBVar5 + uVar34;
  uVar13 = (ulong)((uVar33 & uVar31) * 2);
  local_a8 = local_38 + uVar13;
  puVar23 = local_38 + uVar13 + 1;
  local_e0 = uVar31 + 9;
  uVar13 = (ulong)(lengthToBeat - 1);
  puVar27 = (ulong *)(ip + 3);
  puVar1 = (ulong *)(iHighLimit + -7);
  puVar2 = (ulong *)(iHighLimit + -3);
  puVar14 = (ulong *)(iHighLimit + -1);
  uVar35 = (ulong)ll0;
  do {
    if (uVar35 == 3) {
      uVar21 = *rep - 1;
    }
    else {
      uVar21 = rep[uVar35];
    }
    if (uVar31 < uVar4) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x281,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    uVar25 = uVar31 - uVar21;
    if (uVar21 - 1 < uVar31 - uVar4) {
      uVar11 = 0;
      if ((uVar29 <= uVar25) &&
         (uVar11 = 0, ((*(uint *)(ip + -(ulong)uVar21) ^ *(uint *)ip) & 0xffffff) == 0)) {
        lVar26 = -(ulong)uVar21;
        puVar28 = (ulong *)((long)puVar27 + lVar26);
        puVar19 = puVar27;
        if (puVar27 < puVar1) {
          if (*puVar28 == *puVar27) {
            lVar26 = lVar26 + 0xb;
            lVar22 = 0;
            do {
              puVar19 = (ulong *)(ip + lVar22 + 0xb);
              if (puVar1 <= puVar19) {
                puVar28 = (ulong *)(ip + lVar22 + lVar26);
                goto LAB_007430ea;
              }
              lVar7 = lVar22 + lVar26;
              lVar22 = lVar22 + 8;
            } while (*(ulong *)(ip + lVar7) == *puVar19);
            uVar15 = *puVar19 ^ *(ulong *)(ip + lVar7);
            uVar30 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar11 = ((uint)(uVar30 >> 3) & 0x1fffffff) + (int)lVar22;
          }
          else {
            uVar15 = *puVar27 ^ *puVar28;
            uVar30 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar11 = (uint)(uVar30 >> 3) & 0x1fffffff;
          }
        }
        else {
LAB_007430ea:
          if ((puVar19 < puVar2) && ((int)*puVar28 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar28 = (ulong *)((long)puVar28 + 4);
          }
          if ((puVar19 < puVar14) && ((short)*puVar28 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar28 = (ulong *)((long)puVar28 + 2);
          }
          if (puVar19 < iHighLimit) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar19));
          }
          uVar11 = (int)puVar19 - (int)puVar27;
        }
LAB_00743132:
        uVar11 = uVar11 + 3;
      }
    }
    else {
      if (uVar31 < uVar29) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x28d,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar11 = 0;
      if (((uVar21 - 1 < uVar31 - uVar29) && (uVar25 - uVar4 < 0xfffffffd)) &&
         (((*(uint *)(pBVar6 + uVar25) ^ *(uint *)ip) & 0xffffff) == 0)) {
        sVar16 = ZSTD_count_2segments
                           ((BYTE *)puVar27,(BYTE *)((long)(pBVar6 + uVar25) + 3),iHighLimit,mEnd,
                            iStart);
        uVar11 = (uint)sVar16;
        goto LAB_00743132;
      }
    }
    uVar30 = (ulong)uVar11;
    if (uVar13 < uVar30) {
      matches[uVar36].off = ((int)uVar35 - ll0) + 1;
      matches[uVar36].len = uVar11;
      uVar21 = (int)uVar36 + 1;
      uVar36 = (ulong)uVar21;
      if (uVar37 < uVar11) {
        return uVar21;
      }
      uVar13 = uVar30;
      if (ip + uVar30 == iHighLimit) {
        return uVar21;
      }
    }
    uVar35 = uVar35 + 1;
  } while (ll0 + 3 != (int)uVar35);
  if (((uVar13 < 3) && (UVar8 = ZSTD_insertAndFindFirstIndexHash3(ms,local_50,ip), uVar10 <= UVar8))
     && (uVar31 - UVar8 < 0x40000)) {
    uVar35 = (ulong)UVar8;
    if (UVar8 < uVar4) {
      uVar35 = ZSTD_count_2segments(ip,pBVar6 + uVar35,iHighLimit,mEnd,iStart);
    }
    else {
      puVar27 = (ulong *)(pBVar5 + uVar35);
      puVar28 = (ulong *)ip;
      if (ip < puVar1) {
        if (*puVar27 == *(ulong *)ip) {
          lVar26 = 0;
          do {
            if (puVar1 <= ip + lVar26 + 8) {
              puVar27 = (ulong *)(pBVar5 + lVar26 + uVar35 + 8);
              puVar28 = (ulong *)(ip + lVar26 + 8);
              goto LAB_007432ca;
            }
            lVar22 = lVar26 + uVar35 + 8;
            uVar30 = *(ulong *)(ip + lVar26 + 8);
            lVar26 = lVar26 + 8;
          } while (*(ulong *)(pBVar5 + lVar22) == uVar30);
          uVar30 = uVar30 ^ *(ulong *)(pBVar5 + lVar22);
          uVar35 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = (uVar35 >> 3 & 0x1fffffff) + lVar26;
        }
        else {
          uVar30 = *(ulong *)ip ^ *puVar27;
          uVar35 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar35 = uVar35 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_007432ca:
        if ((puVar28 < puVar2) && ((int)*puVar27 == (int)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 4);
          puVar27 = (ulong *)((long)puVar27 + 4);
        }
        if ((puVar28 < puVar14) && ((short)*puVar27 == (short)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 2);
          puVar27 = (ulong *)((long)puVar27 + 2);
        }
        if (puVar28 < iHighLimit) {
          puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar28));
        }
        uVar35 = (long)puVar28 - (long)ip;
      }
    }
    if (2 < uVar35) {
      if (uVar31 <= UVar8) {
        __assert_fail("curr > matchIndex3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2ba,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((int)uVar36 != 0) {
        __assert_fail("mnum==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,699,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      matches->off = (uVar31 - UVar8) + 3;
      matches->len = (U32)uVar35;
      uVar36 = 1;
      uVar13 = uVar35;
      if (uVar37 < uVar35 || ip + uVar35 == iHighLimit) {
        UVar32 = uVar31 + 1;
        UVar8 = 1;
        goto LAB_007433dd;
      }
    }
  }
  UVar8 = (U32)uVar36;
  local_48[local_40] = uVar31;
  if (uVar10 <= uVar3) {
    uVar30 = 0;
    uVar35 = 0;
    do {
      uVar18 = (ulong)uVar3;
      uVar15 = uVar35;
      if (uVar30 < uVar35) {
        uVar15 = uVar30;
      }
      if (uVar31 <= uVar3) {
        __assert_fail("curr > matchIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2cd,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar17 = uVar18 + uVar15;
      if (uVar17 < uVar34) {
        __s1 = pBVar6 + uVar18;
        iVar12 = bcmp(__s1,ip,uVar15);
        if (iVar12 != 0) {
          __assert_fail("memcmp(match, ip, matchLength) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2d6,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        sVar16 = ZSTD_count_2segments(ip + uVar15,__s1 + uVar15,iHighLimit,mEnd,iStart);
        uVar15 = sVar16 + uVar15;
        __s1_00 = pBVar5 + uVar18;
        if (uVar15 + uVar18 < uVar34) {
          __s1_00 = __s1;
        }
      }
      else {
        __s1_00 = pBVar5 + uVar18;
        if ((uVar4 <= uVar3) && (iVar12 = bcmp(__s1_00,ip,uVar15), iVar12 != 0)) {
          __assert_fail("memcmp(match, ip, matchLength) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2d2,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        puVar27 = (ulong *)(ip + uVar15);
        puVar28 = (ulong *)(__s1_00 + uVar15);
        puVar19 = puVar27;
        if (puVar27 < puVar1) {
          if (*puVar28 == *puVar27) {
            lVar26 = 0;
            do {
              puVar19 = (ulong *)(ip + lVar26 + uVar15 + 8);
              if (puVar1 <= puVar19) {
                puVar28 = (ulong *)(pBVar5 + uVar17 + lVar26 + 8);
                goto LAB_007435da;
              }
              lVar22 = lVar26 + uVar17 + 8;
              lVar26 = lVar26 + 8;
            } while (*(ulong *)(pBVar5 + lVar22) == *puVar19);
            uVar17 = *puVar19 ^ *(ulong *)(pBVar5 + lVar22);
            uVar18 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar26;
          }
          else {
            uVar17 = *puVar27 ^ *puVar28;
            uVar18 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_007435da:
          if ((puVar19 < puVar2) && ((int)*puVar28 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar28 = (ulong *)((long)puVar28 + 4);
          }
          if ((puVar19 < puVar14) && ((short)*puVar28 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar28 = (ulong *)((long)puVar28 + 2);
          }
          if (puVar19 < iHighLimit) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar28 == (BYTE)*puVar19));
          }
          uVar18 = (long)puVar19 - (long)puVar27;
        }
        uVar15 = uVar18 + uVar15;
      }
      if (uVar13 < uVar15) {
        if (local_e0 < uVar3 || local_e0 - uVar3 == 0) {
          __assert_fail("matchEndIdx > matchIndex",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x2df,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        if (local_e0 - uVar3 < uVar15) {
          local_e0 = uVar3 + (U32)uVar15;
        }
        matches[uVar36].off = (uVar31 + 3) - uVar3;
        matches[uVar36].len = (U32)uVar15;
        UVar8 = (int)uVar36 + 1;
        uVar36 = (ulong)UVar8;
        if ((0x1000 < uVar15) || (uVar13 = uVar15, ip + uVar15 == iHighLimit)) break;
      }
      UVar8 = (U32)uVar36;
      puVar20 = local_38 + (uVar3 & uVar33) * 2;
      if (__s1_00[uVar15] < ip[uVar15]) {
        *local_a8 = uVar3;
        if (uVar3 <= uVar9) {
          local_a8 = &local_54;
          break;
        }
        puVar20 = puVar20 + 1;
        uVar30 = uVar15;
        local_a8 = puVar20;
      }
      else {
        *puVar23 = uVar3;
        puVar23 = puVar20;
        uVar35 = uVar15;
        if (uVar3 <= uVar9) {
          puVar23 = &local_54;
          break;
        }
      }
      uVar24 = uVar24 - 1;
      if ((uVar24 == 0) || (uVar3 = *puVar20, uVar3 < uVar10)) break;
    } while( true );
  }
  *puVar23 = 0;
  *local_a8 = 0;
  if (0x40000000 < uVar24) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x2fd,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  if (local_e0 <= uVar31 + 8) {
    __assert_fail("matchEndIdx > curr+8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x324,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  UVar32 = local_e0 - 8;
LAB_007433dd:
  ms->nextToUpdate = UVar32;
  return UVar8;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}